

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void restore_tiles(tgestate_t *state)

{
  byte bVar1;
  int iVar2;
  tile_t *ptVar3;
  tgestate_t *in_RDI;
  int8_t visible_height;
  tilerow_t *tilerow;
  uint8_t tile_counter;
  tile_t *tileset;
  tileindex_t tile;
  tileindex_t *tilebuf;
  uint8_t y;
  uint8_t x;
  uint8_t *windowbuf2;
  uint8_t *windowbuf;
  pos8_t *map_position;
  uint8_t clipped_height;
  uint8_t top_skip;
  uint8_t clipped_width;
  uint8_t left_skip;
  uint8_t height_counter;
  uint8_t width_counter;
  uint8_t windowbuf_skip;
  uint8_t tilebuf_skip;
  uint8_t width;
  int8_t bottom;
  uint8_t height;
  vischar_t *vischar;
  uint8_t iters;
  tilerow_t *local_70;
  char local_61;
  byte *local_50;
  byte local_42;
  byte local_41;
  tilerow_t *local_40;
  tilerow_t *local_38;
  byte local_23;
  uint8_t local_22;
  byte local_21;
  uint8_t local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  byte local_1c;
  byte local_1b;
  char local_1a;
  byte local_19;
  vischar_t *local_18;
  char local_9;
  tgestate_t *local_8;
  
  local_9 = '\b';
  in_RDI->IY = in_RDI->vischars;
  local_8 = in_RDI;
  do {
    local_18 = local_8->IY;
    if (local_18->flags != 0xff) {
      (local_8->isopos).y = (uint8_t)((int)(uint)(local_18->isopos).y >> 3);
      (local_8->isopos).x = (uint8_t)((int)(uint)(local_18->isopos).x >> 3);
      iVar2 = vischar_visible(local_8,local_18,&local_20,&local_21,&local_22,&local_23);
      if (iVar2 == 0) {
        local_19 = (char)((int)(uint)local_23 >> 3) + 2;
        local_1a = (local_19 + (local_8->isopos).y) - (local_8->map_position).y;
        bVar1 = local_19;
        if (((local_1a < '\0') || (local_1a = local_1a - (char)local_8->rows, local_1a < '\x01')) ||
           ((bVar1 = local_19 - local_1a, -1 < (char)bVar1 && (bVar1 != 0)))) {
          local_19 = bVar1;
          if (5 < local_19) {
            local_19 = 5;
          }
          local_1b = local_21;
          local_1c = (char)local_8->columns - local_21;
          local_1d = local_1c + (char)local_8->columns * '\a';
          if (local_20 == '\0') {
            local_41 = (local_8->isopos).x - (local_8->map_position).x;
          }
          else {
            local_41 = 0;
          }
          if (local_22 == '\0') {
            local_42 = (local_8->isopos).y - (local_8->map_position).y;
          }
          else {
            local_42 = 0;
          }
          local_38 = local_8->window_buf +
                     (ulong)local_42 * local_8->window_buf_stride + (ulong)local_41;
          local_50 = local_8->tile_buf + (int)((uint)local_41 + (uint)local_42 * local_8->columns);
          local_1f = local_19;
          do {
            local_1e = local_1b;
            do {
              bVar1 = *local_50;
              local_40 = local_38;
              ptVar3 = select_tile_set(local_8,local_41,local_42);
              local_61 = '\b';
              local_70 = ptVar3[bVar1].row;
              do {
                *local_40 = *local_70;
                local_40 = local_40 + local_8->columns;
                local_61 = local_61 + -1;
                local_70 = local_70 + 1;
              } while (local_61 != '\0');
              local_41 = local_41 + 1;
              local_50 = local_50 + 1;
              local_38 = local_38 + 1;
              local_1e = local_1e - 1;
            } while (local_1e != 0);
            local_41 = local_41 - local_1b;
            local_42 = local_42 + 1;
            local_50 = local_50 + (int)(uint)local_1c;
            local_38 = local_38 + (int)(uint)local_1d;
            local_1f = local_1f - 1;
          } while (local_1f != 0);
          local_1e = 0;
          local_1f = 0;
        }
      }
    }
    local_8->IY = local_8->IY + 1;
    local_9 = local_9 + -1;
  } while (local_9 != '\0');
  return;
}

Assistant:

void restore_tiles(tgestate_t *state)
{
  uint8_t            iters;                         /* was B */
  const vischar_t   *vischar;                       /* new local copy */
  uint8_t            height;                        /* was A/$BC5F */
  int8_t             bottom;                        /* was A */
  uint8_t            width;                         /* was $BC61 */
  uint8_t            tilebuf_skip;                  /* was $BC8E */
  uint8_t            windowbuf_skip;                /* was $BC95 */
  uint8_t            width_counter, height_counter; /* was B,C */
  uint8_t            left_skip;                     /* was B */
  uint8_t            clipped_width;                 /* was C */
  uint8_t            top_skip;                      /* was D */
  uint8_t            clipped_height;                /* was E */
  const pos8_t      *map_position;                  /* was HL */
  uint8_t           *windowbuf;                     /* was HL */
  uint8_t           *windowbuf2;                    /* was DE */
  uint8_t            x, y;                          /* was H', L' */
  const tileindex_t *tilebuf;                       /* was HL/DE */
  tileindex_t        tile;                          /* was A */
  const tile_t      *tileset;                       /* was BC */
  uint8_t            tile_counter;                  /* was B' */
  const tilerow_t   *tilerow;                       /* was HL' */

  assert(state != NULL);

  iters     = vischars_LENGTH;
  state->IY = &state->vischars[0];
  do
  {
    vischar = state->IY; /* Conv: Added local copy of IY. */

    if (vischar->flags == vischar_FLAGS_EMPTY_SLOT)
      goto next;

    /* Get the visible character's position in screen space. */
    state->isopos.y = vischar->isopos.y >> 3; /* divide by 8 (16-to-8) */
    state->isopos.x = vischar->isopos.x >> 3; /* divide by 8 (16-to-8) */

    if (vischar_visible(state,
                        vischar,
                       &left_skip,
                       &clipped_width,
                       &top_skip,
                       &clipped_height))
      goto next; /* not visible */

    /* Compute scaled clipped height. */
    /* Conv: Rotate and mask turned into right shift. */
    height = (clipped_height >> 3) + 2; /* TODO: Explain the +2 fudge factor. */

    /* Note: It seems that the following sequence (from here to clamp_height)
     * duplicates the work done by vischar_visible. I can't see any benefit to
     * it. */

    /* Compute bottom = height + isopos_y - map_position_y. This is the
     * distance of the (clipped) bottom edge of the vischar from the top of the
     * window. */
    bottom = height + state->isopos.y - state->map_position.y;
    if (bottom >= 0)
    {
      /* Bottom edge is on-screen, or off the bottom of the screen. */

      bottom -= state->rows; /* i.e. 17 */
      if (bottom > 0)
      {
        /* Bottom edge is now definitely visible. */

        int8_t visible_height; /* was A */

        visible_height = height - bottom;
        if (visible_height < 0)
        {
          goto next; /* not visible */
        }
        else if (visible_height != 0)
        {
          height = visible_height;
          goto clamp_height;
        }
        else
        {
          /* Note: Could merge this case into the earlier one. */
          assert(visible_height == 0);
          goto next; /* not visible */
        }
      }
    }

clamp_height:
    /* Clamp the height to a maximum of five. */
    if (height > 5)
      height = 5;

    /* Conv: Self modifying code replaced. */

    width          = clipped_width;
    tilebuf_skip   = state->columns - width;
    windowbuf_skip = tilebuf_skip + 7 * state->columns;

    map_position   = &state->map_position;

    /* Work out x,y offsets into the tile buffer. */

    if (left_skip == 0)
      x = state->isopos.x - map_position->x;
    else
      x = 0; /* was interleaved */

    if (top_skip == 0)
      y = state->isopos.y - map_position->y;
    else
      y = 0; /* was interleaved */

    /* Calculate the offset into the window buffer. */

    windowbuf = &state->window_buf[y * state->window_buf_stride + x];
    ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);

    /* Calculate the offset into the tile buffer. */

    tilebuf = &state->tile_buf[x + y * state->columns];
    ASSERT_TILE_BUF_PTR_VALID(tilebuf);

    height_counter = height; /* in rows */
    do
    {
      width_counter = width; /* in columns */
      do
      {
        ASSERT_TILE_BUF_PTR_VALID(tilebuf);

        tile = *tilebuf;
        windowbuf2 = windowbuf;

        tileset = select_tile_set(state, x, y);

        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf2, 0);
        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf2 + 7 * state->columns, 0);

        /* Copy the tile into the window buffer. */
        tilerow = &tileset[tile].row[0];
        tile_counter = 8;
        do
        {
          *windowbuf2 = *tilerow++;
          windowbuf2 += state->columns;
        }
        while (--tile_counter);

        /* Move to next column. */
        x++;
        tilebuf++;
        if (width_counter > 1)
          ASSERT_TILE_BUF_PTR_VALID(tilebuf);
        windowbuf++;
        if (width_counter > 1)
          ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);
      }
      while (--width_counter);

      /* Reset x offset. Advance to next row. */
      x -= width;
      y++;
      tilebuf   += tilebuf_skip;
      if (height_counter > 1)
        ASSERT_TILE_BUF_PTR_VALID(tilebuf);
      windowbuf += windowbuf_skip;
      if (height_counter > 1)
        ASSERT_WINDOW_BUF_PTR_VALID(windowbuf, 0);
    }
    while (--height_counter);

next:
    state->IY++;
  }
  while (--iters);
}